

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O2

bool __thiscall cmCTestP4::UpdateImpl(cmCTestP4 *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  char *pcVar5;
  string *arg;
  pointer pbVar6;
  char local_279;
  vector<const_char_*,_std::allocator<const_char_*>_> p4_sync;
  OutputLogger err;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string source;
  string opts;
  string custom;
  OutputLogger out;
  
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out,"P4UpdateCustom",(allocator<char> *)&err);
  cmCTest::GetCTestConfiguration(&custom,pcVar1,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  if (custom._M_string_length == 0) {
    bVar2 = std::operator==(&(this->super_cmCTestGlobalVC).OldRevision,"<unknown>");
    if (bVar2) {
      std::__cxx11::string::assign
                ((char *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.UpdateCommandLine);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
      std::operator<<((ostream *)&out,"   Unknown current revision\n");
      pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestP4.cxx"
                   ,0x1e8,(char *)CONCAT71(err.super_LineParser.super_OutputParser.
                                           _vptr_OutputParser._1_7_,
                                           err.super_LineParser.super_OutputParser.
                                           _vptr_OutputParser._0_1_),false);
      std::__cxx11::string::~string((string *)&err);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
      bVar2 = false;
    }
    else {
      p4_sync.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      p4_sync.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      p4_sync.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      SetP4Options(this,&p4_sync);
      out.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x4faa6c;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&p4_sync,(char **)&out);
      pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&out,"UpdateOptions",(allocator<char> *)&err);
      cmCTest::GetCTestConfiguration(&opts,pcVar1,(string *)&out);
      std::__cxx11::string::~string((string *)&out);
      if (opts._M_string_length == 0) {
        pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&err,"P4UpdateOptions",(allocator<char> *)&source);
        cmCTest::GetCTestConfiguration((string *)&out,pcVar1,(string *)&err);
        std::__cxx11::string::operator=((string *)&opts,(string *)&out);
        std::__cxx11::string::~string((string *)&out);
        std::__cxx11::string::~string((string *)&err);
      }
      cmSystemTools::ParseArguments(&args,&opts);
      for (pbVar6 = args.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar6 != args.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
        out.super_LineParser.super_OutputParser._vptr_OutputParser =
             (_func_int **)(pbVar6->_M_dataplus)._M_p;
        std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&p4_sync,(char **)&out);
      }
      std::operator+(&source,&(this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory,"/...");
      iVar3 = cmCTest::GetTestModel((this->super_cmCTestGlobalVC).super_cmCTestVC.CTest);
      if (iVar3 == 1) {
        cmCTestVC::GetNightlyTime_abi_cxx11_((string *)&out,(cmCTestVC *)this);
        err.super_LineParser.super_OutputParser._vptr_OutputParser._0_1_ = 0x2d;
        local_279 = '/';
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )out.super_LineParser.super_OutputParser._vptr_OutputParser,
                   (char *)((long)&(out.super_LineParser.Log)->_vptr_basic_ostream +
                           (long)out.super_LineParser.super_OutputParser._vptr_OutputParser),
                   (char *)&err,&local_279);
        psVar4 = (string *)std::__cxx11::string::append((char *)&source);
        pcVar5 = (char *)std::__cxx11::string::append(psVar4);
        std::__cxx11::string::append(pcVar5);
        std::__cxx11::string::~string((string *)&out);
      }
      out.super_LineParser.super_OutputParser._vptr_OutputParser =
           (_func_int **)source._M_dataplus._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&p4_sync,(char **)&out);
      out.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x0;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&p4_sync,(char **)&out);
      cmProcessTools::OutputLogger::OutputLogger
                (&out,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"p4_sync-out> ");
      cmProcessTools::OutputLogger::OutputLogger
                (&err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"p4_sync-err> ");
      bVar2 = cmCTestVC::RunUpdateCommand
                        ((cmCTestVC *)this,
                         p4_sync.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                         _M_impl.super__Vector_impl_data._M_start,(OutputParser *)&out,
                         (OutputParser *)&err,Auto);
      cmProcessTools::LineParser::~LineParser(&err.super_LineParser);
      cmProcessTools::LineParser::~LineParser(&out.super_LineParser);
      std::__cxx11::string::~string((string *)&source);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&args);
      std::__cxx11::string::~string((string *)&opts);
      std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
                (&p4_sync.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
    }
  }
  else {
    bVar2 = UpdateCustom(this,&custom);
  }
  std::__cxx11::string::~string((string *)&custom);
  return bVar2;
}

Assistant:

bool cmCTestP4::UpdateImpl()
{
  std::string custom = this->CTest->GetCTestConfiguration("P4UpdateCustom");
  if (!custom.empty()) {
    return this->UpdateCustom(custom);
  }

  // If we couldn't get a revision number before updating, abort.
  if (this->OldRevision == "<unknown>") {
    this->UpdateCommandLine = "Unknown current revision";
    cmCTestLog(this->CTest, ERROR_MESSAGE, "   Unknown current revision\n");
    return false;
  }

  std::vector<char const*> p4_sync;
  SetP4Options(p4_sync);

  p4_sync.push_back("sync");

  // Get user-specified update options.
  std::string opts = this->CTest->GetCTestConfiguration("UpdateOptions");
  if (opts.empty()) {
    opts = this->CTest->GetCTestConfiguration("P4UpdateOptions");
  }
  std::vector<std::string> args = cmSystemTools::ParseArguments(opts);
  for (std::string const& arg : args) {
    p4_sync.push_back(arg.c_str());
  }

  std::string source = this->SourceDirectory + "/...";

  // Specify the start time for nightly testing.
  if (this->CTest->GetTestModel() == cmCTest::NIGHTLY) {
    std::string date = this->GetNightlyTime();
    // CTest reports the date as YYYY-MM-DD, Perforce needs it as YYYY/MM/DD
    std::replace(date.begin(), date.end(), '-', '/');

    // Revision specification: /...@"YYYY/MM/DD HH:MM:SS"
    source.append("@\"").append(date).append("\"");
  }

  p4_sync.push_back(source.c_str());
  p4_sync.push_back(nullptr);

  OutputLogger out(this->Log, "p4_sync-out> ");
  OutputLogger err(this->Log, "p4_sync-err> ");

  return this->RunUpdateCommand(&p4_sync[0], &out, &err);
}